

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpperf.c
# Opt level: O0

void print_usage(char *prg)

{
  undefined8 in_RDI;
  
  fprintf(_stderr,"%s - ISO15765-2 protocol performance visualisation.\n",in_RDI);
  fprintf(_stderr,"\nUsage: %s [options] <CAN interface>\n",in_RDI);
  fprintf(_stderr,"Options:\n");
  fprintf(_stderr,"         -s <can_id>  (source can_id. Use 8 digits for extended IDs)\n");
  fprintf(_stderr,"         -d <can_id>  (destination can_id. Use 8 digits for extended IDs)\n");
  fprintf(_stderr,"         -x <addr>    (extended addressing mode)\n");
  fprintf(_stderr,"         -X <addr>    (extended addressing mode (rx addr))\n");
  fprintf(_stderr,"\nCAN IDs and addresses are given and expected in hexadecimal values.\n");
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void print_usage(char *prg)
{
	fprintf(stderr, "%s - ISO15765-2 protocol performance visualisation.\n", prg);
	fprintf(stderr, "\nUsage: %s [options] <CAN interface>\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "         -s <can_id>  (source can_id. Use 8 digits for extended IDs)\n");
	fprintf(stderr, "         -d <can_id>  (destination can_id. Use 8 digits for extended IDs)\n");
	fprintf(stderr, "         -x <addr>    (extended addressing mode)\n");
	fprintf(stderr, "         -X <addr>    (extended addressing mode (rx addr))\n");
	fprintf(stderr, "\nCAN IDs and addresses are given and expected in hexadecimal values.\n");
	fprintf(stderr, "\n");
}